

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

Vec_Ptr_t * Cmd_ReadFiles(char *pFileList)

{
  FILE *__stream;
  Vec_Ptr_t *p;
  char *pcVar1;
  size_t sVar2;
  Gia_Man_t *Entry;
  char pBuffer [1000];
  undefined8 uStack_420;
  byte local_418 [1000];
  
  uStack_420 = 0x2d0a4d;
  pcVar1 = pFileList;
  __stream = fopen(pFileList,"rb");
  if (__stream == (FILE *)0x0) {
    p = (Vec_Ptr_t *)0x0;
    uStack_420 = 0x2d0b11;
    printf("File containing list of files \"%s\" cannot be opened.\n",pFileList);
  }
  else {
    uStack_420 = 0x2d0a5e;
    p = Vec_PtrAlloc((int)pcVar1);
    while( true ) {
      uStack_420 = 0x2d0a8f;
      pcVar1 = fgets((char *)local_418,1000,__stream);
      if (pcVar1 == (char *)0x0) break;
      if ((0x23 < (ulong)local_418[0]) || ((0x900002600U >> ((ulong)local_418[0] & 0x3f) & 1) == 0))
      {
        while( true ) {
          uStack_420 = 0x2d0ab3;
          sVar2 = strlen((char *)local_418);
          if ((0x20 < (ulong)local_418[sVar2 - 1]) ||
             ((0x100002600U >> ((ulong)local_418[sVar2 - 1] & 0x3f) & 1) == 0)) break;
          local_418[sVar2 - 1] = 0;
        }
        uStack_420 = 0x2d0ad3;
        Entry = Gia_AigerRead((char *)local_418,0,0,0);
        if (Entry == (Gia_Man_t *)0x0) {
          uStack_420 = 0x2d0af2;
          printf("Cannot read AIG from file \"%s\".\n",local_418);
        }
        else {
          uStack_420 = 0x2d0ae3;
          Vec_PtrPush(p,Entry);
        }
      }
    }
    uStack_420 = 0x2d0afc;
    fclose(__stream);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Cmd_ReadFiles( char * pFileList )
{
    Gia_Man_t * pGia;
    Vec_Ptr_t * vAigs;
    char pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pFileList, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pFileList ); return NULL; }
    vAigs = Vec_PtrAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the file
        pGia = Gia_AigerRead( pBuffer, 0, 0, 0 );
        if ( pGia == NULL )
        {
            printf( "Cannot read AIG from file \"%s\".\n", pBuffer );
            continue;
        }
        Vec_PtrPush( vAigs, pGia );
    }
    fclose( pFile );
    return vAigs;
}